

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O1

bool ON_String::EqualOrdinal
               (char *string1,int element_count1,char *string2,int element_count2,
               bool bOrdinalIgnoreCase)

{
  ON__UINT32 OVar1;
  ON__UINT32 OVar2;
  long lVar3;
  int iVar4;
  char *pcVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  bool bVar10;
  char null_terminator;
  char local_49;
  uint local_48;
  uint local_44;
  char *local_40;
  char *local_38;
  
  if ((string1 == (char *)0x0 && element_count1 != 0) ||
     (element_count2 != 0 && string2 == (char *)0x0)) {
    if (string1 == (char *)0x0 || string1 == string2) {
      return string1 == string2;
    }
    if (string2 != (char *)0x0) goto LAB_005c4f85;
LAB_005c50d4:
    bVar10 = false;
  }
  else {
LAB_005c4f85:
    local_49 = '\0';
    if (element_count1 < 0) {
      element_count1 = Length(string1);
    }
    if (element_count2 < 0) {
      element_count2 = Length(string2);
    }
    if (element_count1 == 0) {
      string1 = &local_49;
    }
    if (element_count2 == 0) {
      string2 = &local_49;
    }
    if (element_count1 == element_count2 && string1 == string2) {
      return true;
    }
    local_48 = element_count1;
    uVar8 = element_count2;
    if (element_count1 < element_count2) {
      uVar8 = element_count1;
    }
    bVar10 = 0 < (int)uVar8;
    if (bOrdinalIgnoreCase) {
      local_44 = element_count2;
      if ((int)uVar8 < 1) {
        uVar7 = 0;
      }
      else {
        local_40 = string1 + uVar8;
        local_38 = string2 + uVar8;
        uVar6 = 0;
        pcVar5 = string2;
        pcVar9 = string1;
        do {
          OVar1 = MapCodePointOrdinal((int)*pcVar9,0x7f,
                                      MinimumOrdinal - ((int)*pcVar9 - 0x41U < 0x3a));
          OVar2 = MapCodePointOrdinal((int)*pcVar5,0x7f,
                                      MinimumOrdinal - ((int)*pcVar5 - 0x41U < 0x3a));
          string2 = pcVar5 + 1;
          string1 = pcVar9 + 1;
          uVar7 = uVar6;
          if (OVar1 != OVar2) break;
          uVar6 = uVar6 + 1;
          bVar10 = (int)uVar6 < (int)uVar8;
          string2 = local_38;
          string1 = local_40;
          uVar7 = uVar8;
          pcVar5 = pcVar5 + 1;
          pcVar9 = pcVar9 + 1;
        } while (uVar8 != uVar6);
      }
      pcVar5 = string2;
      pcVar9 = string1;
      uVar8 = uVar7;
      if (bVar10) goto LAB_005c50d4;
    }
    else {
      local_44 = element_count2;
      if ((int)uVar8 < 1) {
        uVar8 = 0;
        pcVar5 = string2;
        pcVar9 = string1;
      }
      else {
        pcVar5 = string2 + uVar8;
        pcVar9 = string1 + uVar8;
        uVar7 = element_count1;
        if (element_count2 < element_count1) {
          uVar7 = element_count2;
        }
        lVar3 = 0;
        do {
          if (string1[lVar3] != string2[lVar3]) goto LAB_005c50d4;
          lVar3 = lVar3 + 1;
        } while (uVar7 != (uint)lVar3);
      }
    }
    bVar10 = true;
    uVar7 = uVar8;
    if ((int)uVar8 < (int)local_48) {
      lVar3 = 0;
      do {
        if (pcVar9[lVar3] != '\0') goto LAB_005c50d4;
        lVar3 = lVar3 + 1;
        uVar7 = local_48;
      } while (local_48 - uVar8 != (int)lVar3);
    }
    if ((int)uVar7 < (int)local_44) {
      lVar3 = 0;
      do {
        bVar10 = pcVar5[lVar3] == '\0';
        if (!bVar10) {
          return bVar10;
        }
        iVar4 = (int)lVar3;
        lVar3 = lVar3 + 1;
      } while (~uVar7 + local_44 != iVar4);
    }
  }
  return bVar10;
}

Assistant:

bool ON_String::EqualOrdinal(
  const char* string1,
  int element_count1,
  const char* string2,
  int element_count2,
  bool bOrdinalIgnoreCase
  )
{
  CHAR_STRING_EQUAL_PREAMBLE(string1,element_count1,string2,element_count2);

  const int element_count = (element_count1 <= element_count2) ? element_count1 : element_count2;
  int i;
  if (bOrdinalIgnoreCase)
  {
    unsigned int c1, c2;
    for(i = 0; i < element_count; i++)
    {
      c1 = OrdinalUTF8ToIgnoreCase(*string1++);
      c2 = OrdinalUTF8ToIgnoreCase(*string2++);
      if ( c1 != c2 )
        return false;
    }
  }
  else
  {
    for(i = 0; i < element_count; i++)
    {
      if ((*string1++) != (*string2++))
        return false;
    }
  }

  for (/*empty init*/; i < element_count1; i++)
  {
    if ( 0 != (*string1++))
      return false;
  }

  for (/*empty init*/; i < element_count2; i++)
  {
    if ( 0 != (*string2++))
      return false;
  }

  return true;
}